

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_mkdir(char *_dname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  _func_int_void_ptr_char_ptr *p_Var3;
  DirHandle *pDVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ulong *puVar8;
  char *pcVar9;
  ErrState *pEVar10;
  PHYSFS_Stat *pPVar11;
  PHYSFS_ErrorCode errcode;
  ulong *puVar12;
  bool bVar13;
  PHYSFS_Stat local_68;
  ulong *local_40;
  ulong *local_38;
  
  pPVar11 = &local_68;
  if (_dname == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_00108629:
    *(undefined8 *)((long)pPVar11 + -8) = 0x10862e;
    PHYSFS_setErrorCode(errcode);
    return 0;
  }
  sVar7 = strlen(_dname);
  if (sVar7 + 1 < 0x100) {
    puVar8 = (ulong *)((long)&local_68 - (sVar7 + 0x18 & 0xfffffffffffffff0));
    pPVar11 = (PHYSFS_Stat *)puVar8;
  }
  else {
    puVar8 = (ulong *)0x0;
    pPVar11 = &local_68;
  }
  bVar13 = puVar8 == (ulong *)0x0;
  if (bVar13) {
    *(undefined8 *)((long)pPVar11 + -8) = 0x108516;
    puVar8 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar7 + 9);
  }
  if (puVar8 == (ulong *)0x0) {
    puVar8 = (ulong *)0x0;
  }
  else {
    *puVar8 = (ulong)bVar13;
    puVar8 = puVar8 + 1;
  }
  if (puVar8 == (ulong *)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_00108629;
  }
  local_40 = puVar8;
  *(undefined8 *)((long)pPVar11 + -8) = 0x108544;
  iVar5 = sanitizePlatformIndependentPath(_dname,(char *)puVar8);
  if (iVar5 == 0) {
    uVar6 = 0;
    goto LAB_00108651;
  }
  *(undefined8 *)((long)pPVar11 + -8) = 0x108558;
  __PHYSFS_platformGrabMutex(stateLock);
  pDVar4 = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    *(undefined8 *)((long)pPVar11 + -8) = 0x108642;
    PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
LAB_00108642:
    uVar6 = 0;
  }
  else {
    bVar13 = true;
    *(undefined8 *)((long)pPVar11 + -8) = 0x10857f;
    iVar5 = verifyPath(writeDir,(char **)&local_40,1);
    if (iVar5 == 0) goto LAB_00108642;
    local_38 = local_40;
    uVar6 = 0;
    puVar12 = local_40;
    while( true ) {
      *(undefined8 *)((long)pPVar11 + -8) = 0x10859f;
      pcVar9 = strchr((char *)puVar12,0x2f);
      puVar12 = local_38;
      if (pcVar9 != (char *)0x0) {
        *pcVar9 = '\0';
      }
      if (bVar13) {
        pvVar1 = pDVar4->opaque;
        p_Var2 = pDVar4->funcs->stat;
        *(undefined8 *)((long)pPVar11 + -8) = 0x1085c2;
        iVar5 = (*p_Var2)(pvVar1,(char *)puVar12,&local_68);
        if (iVar5 == 0) {
          *(undefined8 *)((long)pPVar11 + -8) = 0x1085ce;
          pEVar10 = findErrorForCurrentThread();
          if ((pEVar10 != (ErrState *)0x0) && (pEVar10->code == PHYSFS_ERR_NOT_FOUND)) {
            bVar13 = false;
          }
        }
        uVar6 = (uint)(local_68.filetype == PHYSFS_FILETYPE_DIRECTORY && iVar5 != 0);
      }
      else {
        bVar13 = false;
      }
      puVar12 = local_38;
      if (!bVar13) {
        pvVar1 = pDVar4->opaque;
        p_Var3 = pDVar4->funcs->mkdir;
        *(undefined8 *)((long)pPVar11 + -8) = 0x10860b;
        uVar6 = (*p_Var3)(pvVar1,(char *)puVar12);
      }
      if ((pcVar9 == (char *)0x0) || (uVar6 == 0)) break;
      *pcVar9 = '/';
      puVar12 = (ulong *)(pcVar9 + 1);
    }
  }
  *(undefined8 *)((long)pPVar11 + -8) = 0x108651;
  __PHYSFS_platformReleaseMutex(stateLock);
LAB_00108651:
  if (puVar8[-1] == 0) {
    return uVar6;
  }
  *(undefined8 *)((long)pPVar11 + -8) = 0x108665;
  (*__PHYSFS_AllocatorHooks.Free)(puVar8 + -1);
  return uVar6;
}

Assistant:

int PHYSFS_mkdir(const char *_dname)
{
    int retval = 0;
    char *dname;
    size_t len;

    BAIL_IF(!_dname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_dname) + 1;
    dname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!dname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doMkdir(_dname, dname);
    __PHYSFS_smallFree(dname);
    return retval;
}